

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_mull(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  uint32_t uVar1;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  TCGv_i32 pTVar3;
  int nr;
  TCGArg a1;
  TCGOpcode opc;
  uintptr_t o_4;
  ulong uVar4;
  TCGv_i32 *ppTVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  if ((uVar1 >> 10 & 1) == 0) {
    pTVar2 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 == tcg_ctx->NULL_QREG) {
LAB_006f9632:
      uVar1 = (s->base).pc_next;
      nr = 3;
LAB_006f963d:
      gen_exception(s,uVar1,nr);
      return;
    }
    if ((s->env->features & 1) == 0) {
      uVar4 = (ulong)(uVar1 >> 9 & 0x38);
      a1 = (long)&tcg_ctx->pool_cur + *(long *)((long)tcg_ctx->cpu_dregs + uVar4);
      tcg_gen_op3_m68k(tcg_ctx,INDEX_op_mul_i32,a1,(TCGArg)(pTVar2 + (long)tcg_ctx),a1);
      gen_logic_cc(s,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar4),2);
      return;
    }
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),0);
    uVar4 = (ulong)(uVar1 >> 9 & 0x38);
    pTVar3 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar4);
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_mulu2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_V,pTVar2,pTVar3);
      ppTVar5 = &QREG_CC_C;
    }
    else {
      tcg_gen_muls2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_V,pTVar2,pTVar3);
      ppTVar5 = &QREG_CC_Z;
      tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,0x1f);
    }
    tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_V,QREG_CC_V,*ppTVar5);
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_neg_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_V + (long)tcg_ctx));
    pTVar2 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar4);
    if (pTVar2 != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar2 + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    if (QREG_CC_Z == QREG_CC_N) goto LAB_006f9801;
    pTVar3 = QREG_CC_N + (long)tcg_ctx;
    opc = INDEX_op_mov_i32;
    pTVar2 = QREG_CC_Z;
  }
  else {
    if ((s->env->features & 0x40000) == 0) {
      uVar1 = (s->base).pc_next;
      nr = 4;
      goto LAB_006f963d;
    }
    pTVar2 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 == tcg_ctx->NULL_QREG) goto LAB_006f9632;
    uVar4 = (ulong)(uVar1 >> 9 & 0x38);
    pTVar3 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar4);
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_mulu2_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,pTVar2,pTVar3);
    }
    else {
      tcg_gen_muls2_i32_m68k(tcg_ctx,QREG_CC_Z,QREG_CC_N,pTVar2,pTVar3);
    }
    if (tcg_ctx->cpu_dregs[uVar1 & 7] != QREG_CC_N) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,
                       (TCGArg)(tcg_ctx->cpu_dregs[uVar1 & 7] + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_N + (long)tcg_ctx));
    }
    pTVar2 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + uVar4);
    if (pTVar2 != QREG_CC_Z) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar2 + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_Z + (long)tcg_ctx));
    }
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_Z + (long)tcg_ctx),(TCGArg)(QREG_CC_N + (long)tcg_ctx));
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),0);
    opc = INDEX_op_movi_i32;
    pTVar3 = (TCGv_i32)0x0;
    pTVar2 = QREG_CC_C;
  }
  tcg_gen_op2_m68k(tcg_ctx,opc,(TCGArg)(pTVar2 + (long)tcg_ctx),(TCGArg)pTVar3);
LAB_006f9801:
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(mull)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv src1;
    int sign;

    ext = read_im16(env, s);

    sign = ext & 0x800;

    if (ext & 0x400) {
        if (!m68k_feature(s->env, M68K_FEATURE_QUAD_MULDIV)) {
            gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
            return;
        }

        SRC_EA(env, src1, OS_LONG, 0, NULL);

        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        }
        /* if Dl == Dh, 68040 returns low word */
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 0), QREG_CC_N);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_Z);
        tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N);

        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);

        set_cc_op(s, CC_OP_FLAGS);
        return;
    }
    SRC_EA(env, src1, OS_LONG, 0, NULL);
    if (m68k_feature(s->env, M68K_FEATURE_M68000)) {
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != (QREG_CC_N >> 31)) */
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, 31);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_Z);
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != 0), use QREG_CC_C as 0 */
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_C);
        }
        tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_N);

        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);

        set_cc_op(s, CC_OP_FLAGS);
    } else {
        /*
         * The upper 32 bits of the product are discarded, so
         * muls.l and mulu.l are functionally equivalent.
         */
        tcg_gen_mul_i32(tcg_ctx, DREG(ext, 12), src1, DREG(ext, 12));
        gen_logic_cc(s, DREG(ext, 12), OS_LONG);
    }
}